

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineSegment.cpp
# Opt level: O3

void __thiscall
vectorgraphics::LineSegment3D::LineSegment3D
          (LineSegment3D *this,double start_x,double start_y,double start_z,double end_x,
          double end_y,double end_z)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_Primitive).sub_primitive_ptrs_.
  super__Vector_base<std::shared_ptr<vectorgraphics::Primitive>,_std::allocator<std::shared_ptr<vectorgraphics::Primitive>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Primitive).sub_primitive_ptrs_.
  super__Vector_base<std::shared_ptr<vectorgraphics::Primitive>,_std::allocator<std::shared_ptr<vectorgraphics::Primitive>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Primitive).style_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Primitive).style_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Primitive).flag_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Primitive).style_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Primitive).flag_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Primitive).flag_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Primitive).sub_primitive_ptrs_.
  super__Vector_base<std::shared_ptr<vectorgraphics::Primitive>,_std::allocator<std::shared_ptr<vectorgraphics::Primitive>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0010ecb8;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[1]._M_use_count = 0;
  p_Var1[1]._M_weak_count = 0;
  p_Var1[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[2]._M_use_count = 0;
  p_Var1[2]._M_weak_count = 0;
  p_Var1[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[3]._M_use_count = 0;
  p_Var1[3]._M_weak_count = 0;
  p_Var1[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[4]._M_use_count = 0;
  p_Var1[4]._M_weak_count = 0;
  p_Var1[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(double *)&p_Var1[5]._M_use_count = start_x;
  p_Var1[6]._vptr__Sp_counted_base = (_func_int **)start_y;
  *(double *)&p_Var1[6]._M_use_count = start_z;
  (this->start_ptr_).super___shared_ptr<vectorgraphics::Point3D,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  (this->start_ptr_).super___shared_ptr<vectorgraphics::Point3D,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)(p_Var1 + 1);
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0010ecb8;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[1]._M_use_count = 0;
  p_Var1[1]._M_weak_count = 0;
  p_Var1[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[2]._M_use_count = 0;
  p_Var1[2]._M_weak_count = 0;
  p_Var1[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[3]._M_use_count = 0;
  p_Var1[3]._M_weak_count = 0;
  p_Var1[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[4]._M_use_count = 0;
  p_Var1[4]._M_weak_count = 0;
  p_Var1[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(double *)&p_Var1[5]._M_use_count = end_x;
  p_Var1[6]._vptr__Sp_counted_base = (_func_int **)end_y;
  *(double *)&p_Var1[6]._M_use_count = end_z;
  (this->end_ptr_).super___shared_ptr<vectorgraphics::Point3D,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  (this->end_ptr_).super___shared_ptr<vectorgraphics::Point3D,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var1 + 1);
  return;
}

Assistant:

LineSegment3D::LineSegment3D(double start_x, double start_y, double start_z, double end_x, double end_y, double end_z) : 
    start_ptr_(std::make_shared<Point3D>(start_x, start_y, start_z)), 
    end_ptr_(std::make_shared<Point3D>(end_x, end_y, end_z)) {
  }